

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QCborMap *m)

{
  int *piVar1;
  QDebug dbg_00;
  QDebug dbg_01;
  QCborContainerPrivate *pQVar2;
  Stream *pSVar3;
  QDebug *pQVar4;
  long *in_RDX;
  ulong uVar5;
  char *t;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  QCborValueConstRef local_88;
  QCborValueConstRef local_78;
  QDebugStateSaver saver;
  QCborValue local_60;
  QCborValue local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)m);
  *(undefined1 *)&(((m->d).d.ptr)->elements).d.ptr = 0;
  QDebug::operator<<((QDebug *)m,"QCborMap{");
  pQVar2 = (QCborContainerPrivate *)*in_RDX;
  uVar5 = 1;
  uVar6 = uVar5;
  if (pQVar2 != (QCborContainerPrivate *)0x0) {
    uVar6 = (pQVar2->elements).d.size | 1;
  }
  t = "{";
  dbg_00.stream = (Stream *)(local_a8 + 8);
  dbg_01.stream = (Stream *)(local_98 + 8);
  for (lVar7 = uVar6 - 1; lVar7 != 0; lVar7 = lVar7 + -2) {
    local_88.i = uVar5 - 1;
    local_88.d = pQVar2;
    local_78.d = pQVar2;
    local_78.i = uVar5;
    pQVar4 = QDebug::operator<<((QDebug *)m,t);
    local_a8._0_8_ = pQVar4->stream;
    ((Stream *)local_a8._0_8_)->ref = ((Stream *)local_a8._0_8_)->ref + 1;
    QCborValueConstRef::concrete(&local_48,&local_88);
    operator<<(dbg_00,(QCborValue *)local_a8);
    pQVar4 = QDebug::operator<<((QDebug *)dbg_00.stream,", ");
    local_98._0_8_ = pQVar4->stream;
    ((Stream *)local_98._0_8_)->ref = ((Stream *)local_98._0_8_)->ref + 1;
    QCborValueConstRef::concrete(&local_60,&local_78);
    operator<<(dbg_01,(QCborValue *)local_98);
    QDebug::operator<<((QDebug *)dbg_01.stream,'}');
    QDebug::~QDebug((QDebug *)dbg_01.stream);
    QCborValue::~QCborValue((QCborValue *)&local_60);
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug((QDebug *)dbg_00.stream);
    QCborValue::~QCborValue((QCborValue *)&local_48);
    QDebug::~QDebug((QDebug *)local_a8);
    uVar5 = uVar5 + 2;
    t = ", {";
  }
  pQVar4 = QDebug::operator<<((QDebug *)m,'}');
  pSVar3 = pQVar4->stream;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar3;
  piVar1 = &pSVar3->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborMap &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborMap{";
    const char *open = "{";
    for (auto pair : m) {
        dbg << open << pair.first <<  ", " << pair.second << '}';
        open = ", {";
    }
    return dbg << '}';
}